

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_result_pointer
               (sqlite3_context *pCtx,void *pPtr,char *zPType,_func_void_void_ptr *xDestructor)

{
  Mem *p;
  char *pcVar1;
  code *pcVar2;
  
  p = pCtx->pOut;
  if (((p->flags & 0x2400) != 0) || (p->szMalloc != 0)) {
    vdbeMemClear(p);
  }
  pcVar1 = "";
  if (zPType != (char *)0x0) {
    pcVar1 = zPType;
  }
  (p->u).zPType = pcVar1;
  p->z = (char *)pPtr;
  p->flags = 0x8601;
  p->eSubtype = 'p';
  pcVar2 = sqlite3NoopDestructor;
  if (xDestructor != (_func_void_void_ptr *)0x0) {
    pcVar2 = xDestructor;
  }
  p->xDel = pcVar2;
  return;
}

Assistant:

SQLITE_API void sqlite3_result_pointer(
  sqlite3_context *pCtx,
  void *pPtr,
  const char *zPType,
  void (*xDestructor)(void*)
){
  Mem *pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pOut->db->mutex) );
  sqlite3VdbeMemRelease(pOut);
  pOut->flags = MEM_Null;
  sqlite3VdbeMemSetPointer(pOut, pPtr, zPType, xDestructor);
}